

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnCatch(TypeChecker *this,TypeVector *sig)

{
  bool bVar1;
  Result RVar2;
  Label *local_30;
  Label *label;
  TypeVector *pTStack_20;
  Result result;
  TypeVector *sig_local;
  TypeChecker *this_local;
  
  pTStack_20 = sig;
  Result::Result((Result *)((long)&label + 4),Ok);
  RVar2 = TopLabel(this,&local_30);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = Check2LabelTypes(this,local_30,Try,Catch);
    Result::operator|=((Result *)((long)&label + 4),RVar2);
    RVar2 = PopAndCheckSignature(this,&local_30->result_types,"try block");
    Result::operator|=((Result *)((long)&label + 4),RVar2);
    RVar2 = CheckTypeStackEnd(this,"try block");
    Result::operator|=((Result *)((long)&label + 4),RVar2);
    ResetTypeStackToLabel(this,local_30);
    local_30->label_type = Catch;
    local_30->unreachable = false;
    PushTypes(this,pTStack_20);
    this_local._4_4_ = label._4_4_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnCatch(const TypeVector& sig) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= Check2LabelTypes(label, LabelType::Try, LabelType::Catch);
  result |= PopAndCheckSignature(label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(label);
  label->label_type = LabelType::Catch;
  label->unreachable = false;
  PushTypes(sig);
  return result;
}